

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O1

void __thiscall
TestParser_TestUnaryStringifyExpr_Test::TestBody(TestParser_TestUnaryStringifyExpr_Test *this)

{
  long *plVar1;
  long *plVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> stmt;
  AssertionResult gtest_ar;
  Parser parser;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  AssertHelper local_c8;
  undefined1 local_c0 [32];
  Lexer local_a0;
  Parser local_70;
  
  local_c0._0_8_ = local_c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"&a","");
  Lexer::Lexer((Lexer *)(local_c0 + 0x20),(string *)local_c0);
  Parser::Parser(&local_70,(Lexer *)(local_c0 + 0x20));
  if ((undefined1 *)
      CONCAT71(local_a0.m_input._M_dataplus._M_p._1_7_,(char)local_a0.m_input._M_dataplus._M_p) !=
      local_c0 + 0x30) {
    operator_delete((undefined1 *)
                    CONCAT71(local_a0.m_input._M_dataplus._M_p._1_7_,
                             (char)local_a0.m_input._M_dataplus._M_p),
                    local_a0.m_input.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  Parser::parse((Parser *)local_c0);
  lVar5 = 0;
  lVar4 = __dynamic_cast(local_c0._0_8_,&AST::Stmt::typeinfo,&AST::ExprStmt::typeinfo,0);
  plVar1 = *(long **)(lVar4 + 8);
  *(undefined8 *)(lVar4 + 8) = 0;
  if (plVar1 != (long *)0x0) {
    lVar5 = __dynamic_cast(plVar1,&AST::Expr::typeinfo,&AST::UnaryExpr::typeinfo,0);
  }
  local_d0.ptr_._0_4_ = 7;
  testing::internal::CmpHelperEQ<TokenType,TokenType>
            ((internal *)(local_c0 + 0x20),"stringifyExpr->m_op","TokenType::Ampersand",
             (TokenType *)(lVar5 + 8),(TokenType *)&local_d0);
  if ((char)local_a0.m_input._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if ((undefined8 *)local_a0.m_input._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_a0.m_input._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ubclaunchpad[P]durian/test/TestParser.cpp"
               ,0xb1,pcVar6);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_d0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_d0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_d0.ptr_ + 8))();
      }
      local_d0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_c0 + 0x28),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_c0 + 0x28),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    plVar2 = *(long **)(lVar5 + 0x10);
    *(undefined8 *)(lVar5 + 0x10) = 0;
    lVar4 = __dynamic_cast(plVar2,&AST::Expr::typeinfo,&AST::Identifier::typeinfo,0);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
              ((internal *)(local_c0 + 0x20),"ident->m_identStr","\"a\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar4 + 8),
               (char (*) [2])0x169fa1);
    if ((char)local_a0.m_input._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_d0);
      if ((undefined8 *)local_a0.m_input._M_string_length == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)local_a0.m_input._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/ubclaunchpad[P]durian/test/TestParser.cpp"
                 ,0xb4,pcVar6);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           (local_d0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_d0.ptr_ + 8))();
        }
        local_d0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_c0 + 0x28),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))(plVar2);
    }
  }
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))(plVar1);
  }
  if ((long *)local_c0._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_c0._0_8_ + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_currToken.literal._M_dataplus._M_p != &local_70.m_currToken.literal.field_2) {
    operator_delete(local_70.m_currToken.literal._M_dataplus._M_p,
                    local_70.m_currToken.literal.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_lexer.m_input._M_dataplus._M_p != &local_70.m_lexer.m_input.field_2) {
    operator_delete(local_70.m_lexer.m_input._M_dataplus._M_p,
                    local_70.m_lexer.m_input.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(TestParser, TestOrExpr) {
    Parser parser(Lexer("a or b"));
    std::unique_ptr<AST::Stmt> stmt = parser.parse();
    auto* exprStmt = dynamic_cast<AST::ExprStmt*>(stmt.get());
    std::unique_ptr<AST::Expr> expr = std::move(exprStmt->m_expr);
    auto* orExpr = dynamic_cast<AST::BinaryExpr*>(expr.get());
    ASSERT_EQ(orExpr->m_op, TokenType::Or);
    std::unique_ptr<AST::Expr> left = std::move(orExpr->m_left);
    auto* lident = dynamic_cast<AST::Identifier*>(left.get());
    std::unique_ptr<AST::Expr> right = std::move(orExpr->m_right);
    auto* rident = dynamic_cast<AST::Identifier*>(right.get());
    ASSERT_EQ(lident->m_identStr, "a");
    ASSERT_EQ(rident->m_identStr, "b");
}